

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

int genNetherScaled(NetherNoise *nn,int *out,Range r,int mc,uint64_t sha)

{
  Range RVar1;
  Range r_00;
  Range r_01;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ulong uVar6;
  int y;
  long lVar7;
  int iVar8;
  long lVar9;
  int *out_00;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int z4;
  int x4;
  int y4;
  Range s;
  undefined8 in_stack_ffffffffffffff84;
  int local_6c;
  int local_68;
  int local_64;
  NetherNoise *local_60;
  undefined4 local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int local_44;
  undefined4 uStack_40;
  uint64_t local_38;
  
  RVar1 = r;
  auVar3 = _DAT_0012dd50;
  if (r.scale < 1) {
    r.scale = 4;
  }
  if (r.sy == 0) {
    r.sy = 1;
  }
  uVar11 = (long)r.sz * (long)r.sy * (long)r.sx;
  if (mc < 0x13) {
    if (uVar11 != 0) {
      lVar12 = uVar11 - 1;
      auVar13._8_4_ = (int)lVar12;
      auVar13._0_8_ = lVar12;
      auVar13._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar6 = 0;
      auVar13 = auVar13 ^ _DAT_0012dd50;
      auVar14 = _DAT_0012dd30;
      auVar15 = _DAT_0012dd40;
      do {
        auVar16 = auVar15 ^ auVar3;
        iVar4 = auVar13._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar4 && auVar13._0_4_ < auVar16._0_4_ ||
                    iVar4 < auVar16._4_4_) & 1)) {
          out[uVar6] = 8;
        }
        if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
            auVar16._12_4_ <= auVar13._12_4_) {
          out[uVar6 + 1] = 8;
        }
        auVar16 = auVar14 ^ auVar3;
        iVar8 = auVar16._4_4_;
        if (iVar8 <= iVar4 && (iVar8 != iVar4 || auVar16._0_4_ <= auVar13._0_4_)) {
          out[uVar6 + 2] = 8;
          out[uVar6 + 3] = 8;
        }
        uVar6 = uVar6 + 4;
        lVar12 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar12 + 4;
        lVar12 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar12 + 4;
      } while ((uVar11 + 3 & 0xfffffffffffffffc) != uVar6);
    }
  }
  else {
    local_60 = nn;
    local_38 = sha;
    if (r.scale != 1) {
      RVar1.x = r.x;
      RVar1.scale = r.scale;
      RVar1.z = r.z;
      RVar1.sx = r.sx;
      RVar1.sz = r.sz;
      RVar1.y = r.y;
      RVar1.sy = r.sy;
      iVar4 = mapNether3D(nn,out,RVar1,1.0);
      return iVar4;
    }
    r_01.sz = r.sy;
    r_01.sx = r.y;
    auVar2 = RVar1._8_12_;
    r_01.scale = auVar2._0_4_;
    r_01.x = auVar2._4_4_;
    r_01.z = auVar2._8_4_;
    r_01._20_8_ = in_stack_ffffffffffffff84;
    getVoronoiSrcRange(r_01);
    out_00 = (int *)0x0;
    if (1 < uVar11) {
      out_00 = out + uVar11;
      r_00.x = iStack_54;
      r_00.scale = local_58;
      r_00.sy = uStack_40;
      r_00.y = local_44;
      r_00.z = iStack_50;
      r_00.sx = iStack_4c;
      r_00.sz = local_48;
      iVar4 = mapNether3D(local_60,out_00,r_00,1.0);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
    if (r.sy < 1) {
      return 0;
    }
    iVar4 = 0;
    do {
      if (0 < r.sz) {
        iVar8 = 0;
        do {
          if (0 < r.sx) {
            iVar10 = 0;
            do {
              voronoiAccess3D(local_38,r.x + iVar10,r.y + iVar4,r.z + iVar8,&local_68,&local_64,
                              &local_6c);
              if (out_00 == (int *)0x0) {
                iVar5 = getNetherBiome(local_60,local_68,y,local_6c,(float *)0x0);
              }
              else {
                lVar12 = (long)local_68;
                local_68 = (int)(lVar12 - iStack_54);
                lVar7 = (long)local_64;
                local_64 = (int)(lVar7 - local_44);
                lVar9 = (long)local_6c;
                local_6c = (int)(lVar9 - iStack_50);
                iVar5 = out_00[((long)local_48 * (lVar7 - local_44) + (lVar9 - iStack_50)) *
                               (long)iStack_4c + (lVar12 - iStack_54)];
              }
              *out = iVar5;
              out = out + 1;
              iVar10 = iVar10 + 1;
            } while (iVar10 < r.sx);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < r.sz);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < r.sy);
  }
  return 0;
}

Assistant:

int genNetherScaled(const NetherNoise *nn, int *out, Range r, int mc, uint64_t sha)
{
    if (r.scale <= 0) r.scale = 4;
    if (r.sy == 0) r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;

    if (mc <= MC_1_15)
    {
        uint64_t i;
        for (i = 0; i < siz; i++)
            out[i] = nether_wastes;
        return 0;
    }

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            int err = mapNether3D(nn, src, s, 1.0);
            if (err)
                return err;
        }
        else
        {
            src = NULL;
        }

        int i, j, k;
        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = getNetherBiome(nn, x4, y4, z4, NULL);
                    }
                    p++;
                }
            }
        }
        return 0;
    }
    else
    {
        return mapNether3D(nn, out, r, 1.0);
    }
}